

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThreads.cpp
# Opt level: O0

bool __thiscall xmrig::OclThreads::isEqual(OclThreads *this,OclThreads *other)

{
  bool bVar1;
  vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *this_00;
  vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *pvVar2;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  bool local_39;
  bool local_1;
  
  bVar1 = isEmpty((OclThreads *)0x21505d);
  if ((bVar1) && (bVar1 = isEmpty((OclThreads *)0x21506d), bVar1)) {
    local_1 = true;
  }
  else {
    this_00 = (vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
              count((OclThreads *)0x215084);
    pvVar2 = (vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_> *)
             count((OclThreads *)0x215092);
    local_39 = false;
    if (this_00 == pvVar2) {
      __first1 = std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::begin(this_00);
      __last1 = std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::end(this_00);
      __first2 = std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>::begin(this_00);
      local_39 = std::
                 equal<__gnu_cxx::__normal_iterator<xmrig::OclThread_const*,std::vector<xmrig::OclThread,std::allocator<xmrig::OclThread>>>,__gnu_cxx::__normal_iterator<xmrig::OclThread_const*,std::vector<xmrig::OclThread,std::allocator<xmrig::OclThread>>>>
                           ((__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                             )__first1._M_current,
                            (__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                             )__last1._M_current,
                            (__normal_iterator<const_xmrig::OclThread_*,_std::vector<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>_>
                             )__first2._M_current);
    }
    local_1 = local_39;
  }
  return local_1;
}

Assistant:

bool xmrig::OclThreads::isEqual(const OclThreads &other) const
{
    if (isEmpty() && other.isEmpty()) {
        return true;
    }

    return count() == other.count() && std::equal(m_data.begin(), m_data.end(), other.m_data.begin());
}